

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

string * __thiscall mocker::Lexer::getToken_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  size_t sVar8;
  byte *pbVar9;
  long lVar10;
  byte *pbVar11;
  size_t local_58;
  
  pbVar2 = (byte *)(this->srcEnd)._M_current;
  pbVar9 = (byte *)(this->nxtBeg)._M_current;
  sVar8 = (this->nxtPos).col;
  local_58 = (this->nxtPos).line;
  pbVar11 = pbVar9;
LAB_00177dc1:
  pbVar7 = pbVar11;
  if ((pbVar11 != pbVar2) && (iVar4 = isspace((int)(char)*pbVar11), iVar4 != 0))
  goto code_r0x00177dd7;
  goto LAB_00177e52;
code_r0x00177dd7:
  lVar10 = 0;
  pbVar9 = pbVar11;
  do {
    pbVar7 = pbVar9 + 1;
    sVar8 = sVar8 + 1;
    (this->nxtPos).col = sVar8;
    if (*pbVar9 == 10) {
      local_58 = local_58 + 1;
      (this->nxtPos).line = local_58;
      (this->nxtPos).col = 1;
      sVar8 = 1;
    }
    (this->nxtBeg)._M_current = (char *)pbVar7;
    if (pbVar7 == pbVar2) {
      pbVar9 = pbVar11 + (1 - lVar10);
      pbVar11 = pbVar7;
      goto LAB_00177dc1;
    }
    iVar5 = isspace((int)(char)*pbVar7);
    lVar10 = lVar10 + -1;
    pbVar9 = pbVar7;
  } while (iVar5 != 0);
  pbVar9 = pbVar11 + -lVar10;
  pbVar11 = pbVar7;
  if (iVar4 == 0) {
LAB_00177e52:
    if ((((long)pbVar2 - (long)pbVar7 < 2) || (*pbVar7 != 0x2f)) || (pbVar7[1] != 0x2f))
    goto LAB_00177ed3;
    pbVar11 = pbVar7;
    if (pbVar7 != pbVar2) {
      do {
        if (*pbVar11 == 10) goto LAB_00177e8e;
        pbVar11 = pbVar11 + 1;
        (this->nxtBeg)._M_current = (char *)pbVar11;
        pbVar9 = pbVar7 + 1;
        pbVar7 = pbVar9;
      } while (pbVar11 != pbVar2);
      pbVar7 = pbVar11;
      if (*pbVar11 == 10) {
LAB_00177e8e:
        pbVar9 = pbVar11 + 1;
        (this->nxtBeg)._M_current = (char *)pbVar9;
        pbVar7 = pbVar9;
      }
    }
    local_58 = local_58 + 1;
    (this->nxtPos).line = local_58;
    (this->nxtPos).col = 1;
    sVar8 = 1;
    pbVar11 = pbVar7;
  }
  goto LAB_00177dc1;
LAB_00177ed3:
  if (pbVar7 == pbVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    (this->curBeg)._M_current = (char *)pbVar9;
    sVar3 = (this->nxtPos).col;
    (this->curPos).line = (this->nxtPos).line;
    (this->curPos).col = sVar3;
    bVar1 = *pbVar9;
    iVar4 = ispunct((int)(char)bVar1);
    if (iVar4 == 0) {
      do {
        sVar8 = sVar8 + 1;
        bVar1 = *pbVar7;
        iVar4 = isalnum((int)(char)bVar1);
        if (((char)bVar1 != 0x5f) && (iVar4 == 0)) break;
        pbVar7 = pbVar7 + 1;
        (this->nxtBeg)._M_current = (char *)pbVar7;
        (this->nxtPos).col = sVar8;
      } while (pbVar7 != pbVar2);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    else {
      pbVar7 = pbVar9 + 1;
      (this->nxtBeg)._M_current = (char *)pbVar7;
      (this->nxtPos).col = sVar8 + 1;
      if (pbVar7 != pbVar2) {
        uVar6 = (uint)bVar1;
        if (((bVar1 == *pbVar7) &&
            (((uVar6 < 0x3f && ((0x7000284000000000U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) ||
             (uVar6 == 0x7c)))) || (((bVar1 & 0xfd) == 0x3c || uVar6 == 0x21 && (*pbVar7 == 0x3d))))
        {
          pbVar7 = pbVar9 + 2;
          (this->nxtBeg)._M_current = (char *)pbVar7;
          (this->nxtPos).col = sVar8 + 2;
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)__return_storage_ptr__,pbVar9,pbVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::getToken() {
  // skip the whitespaces and comments
  auto skipWs = [this]() -> bool /* skipped something? */ {
    bool res = false;
    while (nxtBeg != srcEnd && std::isspace(*nxtBeg)) {
      res = true;
      ++nxtPos.col;
      if (*nxtBeg == '\n') {
        ++nxtPos.line;
        nxtPos.col = 1;
      }
      ++nxtBeg;
    }
    return res;
  };
  auto skipComment = [this]() -> bool {
    if (srcEnd - nxtBeg < 2 || *nxtBeg != '/' || *(nxtBeg + 1) != '/')
      return false;
    while (nxtBeg != srcEnd && *nxtBeg != '\n')
      ++nxtBeg;
    if (*nxtBeg == '\n')
      ++nxtBeg;
    ++nxtPos.line;
    nxtPos.col = 1;
    return true;
  };
  while (skipWs() || skipComment())
    ;

  if (nxtBeg == srcEnd)
    return "";

  curBeg = nxtBeg;
  curPos = nxtPos;
  if (std::ispunct(*nxtBeg)) {
    auto now = *nxtBeg;
    ++nxtBeg;
    ++nxtPos.col;
    if (nxtBeg == srcEnd)
      return {curBeg, nxtBeg};

    if (now == *nxtBeg &&
        (now == '-' || now == '+' || now == '=' || now == '<' || now == '>' ||
         now == '&' || now == '|')) {
      ++nxtBeg;
      ++nxtPos.col;
    } else if (*nxtBeg == '=' && (now == '<' || now == '>')) {
      ++nxtBeg;
      ++nxtPos.col;
    } else if (now == '!' && *nxtBeg == '=') {
      ++nxtBeg;
      ++nxtPos.col;
    }
    return {curBeg, nxtBeg};
  }
  while (nxtBeg != srcEnd && (std::isalnum(*nxtBeg) || *nxtBeg == '_')) {
    ++nxtBeg;
    ++nxtPos.col;
  }
  return {curBeg, nxtBeg};
}